

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayleigh_dist.hpp
# Opt level: O1

result_type_conflict3 * __thiscall
trng::rayleigh_dist<long_double>::icdf
          (result_type_conflict3 *__return_storage_ptr__,rayleigh_dist<long_double> *this,
          result_type_conflict3 x)

{
  result_type_conflict3 *prVar1;
  
  if ((longdouble)0 <= x._0_10_ && x._0_10_ <= (longdouble)1) {
    logl();
    prVar1 = (result_type_conflict3 *)sqrtl();
  }
  else {
    prVar1 = (result_type_conflict3 *)__errno_location();
    *(int *)prVar1 = 0x21;
  }
  return prVar1;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      return P.nu() * math::sqrt(-2 * math::ln(1 - x));
    }